

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O0

double gamma(double param_1)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  undefined4 extraout_XMM0_Db;
  undefined8 local_8;
  
  local_8 = (long)param_1 << 0x20;
  pfVar1 = std::max<float>((float *)&local_8,(float *)((long)&local_8 + 4));
  dVar3 = std::pow((double)(ulong)(uint)(*pfVar1 * 5.5555),5.21455598321582e-315);
  fVar2 = SUB84(dVar3,0) * 84.66;
  local_8 = CONCAT44(fVar2,(float)local_8);
  fVar2 = Imath_3_2::clamp<float>(fVar2,0.0,255.0);
  return (double)CONCAT44(extraout_XMM0_Db,fVar2);
}

Assistant:

unsigned char
gamma (float x)
{
    //
    // Convert a floating-point pixel value to an 8-bit gamma-2.2
    // preview pixel.  (This routine is a simplified version of
    // how the exrdisplay program transforms floating-point pixel
    // values in order to display them on the screen.)
    //

    x = pow (5.5555f * max (0.f, x), 0.4545f) * 84.66f;
    return (unsigned char) IMATH_NAMESPACE::clamp (x, 0.f, 255.f);
}